

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffimport_file(char *filename,char **contents,int *status)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  char *__ptr;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int local_154;
  char line [256];
  
  if (0 < *status) {
    return *status;
  }
  __ptr = (char *)malloc(0x400);
  if (__ptr == (char *)0x0) {
    ffpmsg("Couldn\'t allocate memory to hold ASCII file contents.");
    *status = 0x71;
    iVar8 = 0x71;
  }
  else {
    *__ptr = '\0';
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      snprintf(line,0x100,"Could not open ASCII file %s.",filename);
      ffpmsg(line);
      free(__ptr);
      *status = 0x68;
      iVar8 = 0x68;
    }
    else {
      bVar1 = 1;
      local_154 = 0x400;
      iVar8 = 0;
      while (pcVar4 = fgets(line,0x100,__stream), pcVar4 != (char *)0x0) {
        sVar5 = strlen(line);
        uVar3 = (uint)sVar5;
        if (((!(bool)(bVar1 & 1 < (int)uVar3)) || (line[0] != '/')) || (bVar1 = 1, line[1] != '/'))
        {
          bVar1 = 0;
          bVar2 = true;
          uVar6 = uVar3;
          if ((0 < (int)uVar3) && ((line[uVar3 - 1] == '\r' || (line[uVar3 - 1] == '\n')))) {
            line[uVar3 - 1] = '\0';
            bVar2 = false;
            bVar1 = 1;
            uVar6 = 0;
            if (uVar3 != 1) {
              if ((line[uVar3 - 2] == '\r') || (line[uVar3 - 2] == '\n')) {
                line[uVar3 - 2] = '\0';
                bVar2 = false;
                uVar6 = uVar3 - 2;
              }
              else {
                bVar2 = false;
                uVar6 = uVar3 - 1;
              }
            }
          }
          if (local_154 <= (int)(iVar8 + uVar6 + 3)) {
            local_154 = local_154 + 0x100;
            __ptr = (char *)realloc(__ptr,(long)local_154);
            if (__ptr == (char *)0x0) {
              ffpmsg("Couldn\'t allocate memory to hold ASCII file contents.");
              *status = 0x71;
              __ptr = (char *)0x0;
              break;
            }
          }
          iVar7 = uVar6 + iVar8;
          strcpy(__ptr + iVar8,line);
          iVar8 = iVar7;
          if (!bVar2) {
            (__ptr + iVar7)[0] = ' ';
            (__ptr + iVar7)[1] = '\0';
            iVar8 = iVar7 + 1;
          }
        }
      }
      fclose(__stream);
      *contents = __ptr;
      iVar8 = *status;
    }
  }
  return iVar8;
}

Assistant:

int ffimport_file( char *filename,   /* Text file to read                   */
                   char **contents,  /* Pointer to pointer to hold file     */
                   int *status )     /* CFITSIO error code                  */
/*
   Read and concatenate all the lines from the given text file.  User
   must free the pointer returned in contents.  Pointer is guaranteed
   to hold 2 characters more than the length of the text... allows the
   calling routine to append (or prepend) a newline (or quotes?) without
   reallocating memory.
*/
{
   int allocLen, totalLen, llen, eoline = 1;
   char *lines,line[256];
   FILE *aFile;

   if( *status > 0 ) return( *status );

   totalLen =    0;
   allocLen = 1024;
   lines    = (char *)malloc( allocLen * sizeof(char) );
   if( !lines ) {
      ffpmsg("Couldn't allocate memory to hold ASCII file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   lines[0] = '\0';

   if( (aFile = fopen( filename, "r" ))==NULL ) {
      snprintf(line,256,"Could not open ASCII file %s.",filename);
      ffpmsg(line);
      free( lines );
      return(*status = FILE_NOT_OPENED);
   }

   while( fgets(line,256,aFile)!=NULL ) {
      llen = strlen(line);
      if ( eoline && (llen > 1) && (line[0] == '/' && line[1] == '/'))
          continue;       /* skip comment lines begging with // */

      eoline = 0;

      /* replace CR and newline chars at end of line with nulls */
      if ((llen > 0) && (line[llen-1]=='\n' || line[llen-1] == '\r')) {
          line[--llen] = '\0';
          eoline = 1;   /* found an end of line character */

          if ((llen > 0) && (line[llen-1]=='\n' || line[llen-1] == '\r')) {
                 line[--llen] = '\0';
          }
      }

      if( totalLen + llen + 3 >= allocLen ) {
         allocLen += 256;
         lines = (char *)realloc(lines, allocLen * sizeof(char) );
         if( ! lines ) {
            ffpmsg("Couldn't allocate memory to hold ASCII file contents.");
            *status = MEMORY_ALLOCATION;
            break;
         }
      }
      strcpy( lines+totalLen, line );
      totalLen += llen;

      if (eoline) {
         strcpy( lines+totalLen, " "); /* add a space between lines */
         totalLen += 1;
      }
   }
   fclose(aFile);

   *contents = lines;
   return( *status );
}